

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
          *samples,bool logBucketPerformance)

{
  undefined8 *puVar1;
  pointer pcVar2;
  pointer pUVar3;
  pointer pUVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint uVar12;
  SampleBuilder *pSVar13;
  void *pvVar14;
  ulong *puVar15;
  string *psVar16;
  ulong uVar17;
  int numBytes;
  int *piVar18;
  pointer __src;
  int endNdx;
  long lVar19;
  ulong uVar20;
  size_t __n;
  long lVar21;
  ulong uVar22;
  long *plVar23;
  long lVar24;
  undefined8 *puVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  UploadSampleAnalyzeResult UVar31;
  undefined1 auVar32 [12];
  LineParametersWithConfidence endApproximation;
  size_type __dnew;
  size_type __dnew_1;
  StatsType stats;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section_3;
  ScopedLogSection section_1;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
  buckets [4];
  StatsType resultStats;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  long local_ab0;
  undefined1 local_aa8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a98;
  string local_a88;
  string local_a68;
  qpSampleValueTag local_a48;
  float local_a44;
  float local_a3c;
  LogNumber<float> local_a38;
  LogNumber<float> local_9d0;
  LogNumber<float> local_968;
  LogNumber<float> local_900;
  LogNumber<float> local_898;
  LogNumber<float> local_830;
  LogNumber<float> local_7c8;
  LogNumber<float> local_760;
  undefined1 local_6f8 [8];
  undefined8 local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6e8;
  float local_6d8;
  float fStack_6d4;
  float local_6d0;
  float local_6cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  float local_6b8;
  float fStack_6b4;
  float local_6b0;
  float local_6ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  float local_698;
  float local_694;
  float local_690;
  float local_68c;
  float local_688;
  float local_684;
  float local_680;
  float local_67c;
  LogNumber<float> local_678;
  LogNumber<float> local_610;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  _Alloc_hider local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  _Alloc_hider local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  qpKeyValueTag local_538;
  float local_534;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string *local_390;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  pointer local_1e8;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  LineParametersWithConfidence local_1bc;
  string local_1a0;
  ScopedLogSection local_180;
  undefined1 local_178 [16];
  string local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  MapCallStatistics local_b0;
  
  local_5a8._8_8_ = local_5a8._0_8_;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            (&local_1bc,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  calculateSampleStatistics(&local_b0,&local_1bc,samples);
  local_6f8 = (undefined1  [8])&aStack_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"Samples","");
  local_aa8._0_8_ = &local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_388,log,(string *)local_6f8,(string *)local_aa8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_830.m_name.field_2._M_local_buf[4] = 'l';
  local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x7365;
  local_830.m_name._M_string_length = 7;
  local_830.m_name.field_2._M_local_buf[7] = '\0';
  local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
  local_760.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_760.m_name._M_string_length = 7;
  local_760.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_610,&local_830.m_name,&local_760.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_610.m_name,&local_610.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
  local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7257;
  local_7c8.m_name.field_2._M_local_buf[2] = 'i';
  local_7c8.m_name.field_2._M_allocated_capacity._3_4_ = 0x6e657474;
  local_7c8.m_name.field_2._7_4_ = 0x657a6953;
  local_7c8.m_name._M_string_length = 0xb;
  local_7c8.m_name.field_2._M_local_buf[0xb] = '\0';
  local_598._0_8_ = &local_588;
  local_588._M_allocated_capacity._0_5_ = 0x7474697257;
  local_588._M_allocated_capacity._5_3_ = 0x206e65;
  local_588._8_2_ = 0x6973;
  local_588._M_local_buf[10] = 'z';
  local_588._M_local_buf[0xb] = 'e';
  local_598._8_8_ = 0xc;
  local_588._M_local_buf[0xc] = '\0';
  local_168.field_2._M_allocated_capacity._0_6_ = 0x7365747962;
  local_168._M_string_length = 5;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_6f8,&local_7c8.m_name,(string *)local_598,&local_168,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  local_5a8._0_8_ = samples;
  tcu::TestLog::writeValueInfo
            (log,(string *)local_6f8,(string *)&local_6d8,(string *)&local_6b8,
             (qpSampleValueTag)local_698);
  local_b50.field_2._M_allocated_capacity = 0x6953726566667542;
  local_b50.field_2._8_2_ = 0x657a;
  local_b50._M_string_length = 10;
  local_b50.field_2._M_local_buf[10] = '\0';
  local_b10.field_2._M_allocated_capacity._0_2_ = 0x7542;
  local_b10.field_2._M_local_buf[2] = 'f';
  local_b10.field_2._M_allocated_capacity._3_4_ = 0x20726566;
  local_b10.field_2._7_4_ = 0x657a6973;
  local_b10._M_string_length = 0xb;
  local_b10.field_2._M_local_buf[0xb] = '\0';
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  local_ad0.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_ad0.field_2._M_local_buf[4] = 's';
  local_ad0.field_2._M_local_buf[5] = '\0';
  local_ad0._M_string_length = 5;
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_aa8,&local_b50,&local_b10,&local_ad0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_aa8,&local_a88,&local_a68,local_a48);
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  local_b70.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_b70.field_2._8_2_ = 0x65;
  local_b70._M_string_length = 9;
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  local_b30.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_b30.field_2._8_2_ = 0x656d;
  local_b30._M_string_length = 10;
  local_b30.field_2._M_local_buf[10] = '\0';
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  local_af0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_af0._M_string_length = 2;
  local_af0.field_2._M_allocated_capacity._2_4_ =
       local_af0.field_2._M_allocated_capacity._2_4_ & 0xffffff00;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_a38,&local_b70,&local_b30,&local_af0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_a38.m_name,&local_a38.m_desc,&local_a38.m_unit,local_a38.m_tag);
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  local_b90.field_2._M_allocated_capacity = 0x6d6954636f6c6c41;
  local_b90.field_2._8_2_ = 0x65;
  local_b90._M_string_length = 9;
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  local_bb0.field_2._M_allocated_capacity = 0x697420636f6c6c41;
  local_bb0.field_2._8_2_ = 0x656d;
  local_bb0._M_string_length = 10;
  local_bb0.field_2._M_local_buf[10] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3b0._M_string_length = 2;
  local_3b0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_900,&local_b90,&local_bb0,&local_3b0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_900.m_name,&local_900.m_desc,&local_900.m_unit,local_900.m_tag);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity._0_4_ = 0x5470614d;
  local_450._M_string_length = 7;
  local_450.field_2._M_allocated_capacity._4_4_ = 0x656d69;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity = 0x656d69742070614d;
  local_470._M_string_length = 8;
  local_470.field_2._M_local_buf[8] = '\0';
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3d0._M_string_length = 2;
  local_3d0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_9d0,&local_450,&local_470,&local_3d0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_9d0.m_name,&local_9d0.m_desc,&local_9d0.m_unit,local_9d0.m_tag);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity = 0x6d695470616d6e55;
  local_490.field_2._8_2_ = 0x65;
  local_490._M_string_length = 9;
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity = 0x69742070616d6e55;
  local_4b0.field_2._8_2_ = 0x656d;
  local_4b0._M_string_length = 10;
  local_4b0.field_2._M_local_buf[10] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3f0._M_string_length = 2;
  local_3f0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_968,&local_490,&local_4b0,&local_3f0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_968.m_name,&local_968.m_desc,&local_968.m_unit,local_968.m_tag);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0.field_2._M_allocated_capacity = 0x6d69546574697257;
  local_4d0.field_2._8_2_ = 0x65;
  local_4d0._M_string_length = 9;
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  local_4f0.field_2._M_allocated_capacity = 0x6974206574697257;
  local_4f0.field_2._8_2_ = 0x656d;
  local_4f0._M_string_length = 10;
  local_4f0.field_2._M_local_buf[10] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_410._M_string_length = 2;
  local_410.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_898,&local_4d0,&local_4f0,&local_410,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_898.m_name,&local_898.m_desc,&local_898.m_unit,local_898.m_tag);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  local_510.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_510.field_2._7_4_ = 0x6c617564;
  local_510._M_string_length = 0xb;
  local_510.field_2._M_local_buf[0xb] = '\0';
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  local_530.field_2._M_allocated_capacity = 0x6973657220746946;
  local_530.field_2._8_4_ = 0x6c617564;
  local_530._M_string_length = 0xc;
  local_530.field_2._M_local_buf[0xc] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_430._M_string_length = 2;
  local_430.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_678,&local_510,&local_530,&local_430,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_678.m_name,&local_678.m_desc,&local_678.m_unit,local_678.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_unit._M_dataplus._M_p != &local_678.m_unit.field_2) {
    operator_delete(local_678.m_unit._M_dataplus._M_p,
                    local_678.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_desc._M_dataplus._M_p != &local_678.m_desc.field_2) {
    operator_delete(local_678.m_desc._M_dataplus._M_p,
                    local_678.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT53(local_430.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_430.field_2._M_local_buf[2],
                                      local_430.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT17(local_510.field_2._M_local_buf[7],
                             local_510.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_unit._M_dataplus._M_p != &local_898.m_unit.field_2) {
    operator_delete(local_898.m_unit._M_dataplus._M_p,
                    local_898.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_desc._M_dataplus._M_p != &local_898.m_desc.field_2) {
    operator_delete(local_898.m_desc._M_dataplus._M_p,
                    local_898.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
    operator_delete(local_968.m_unit._M_dataplus._M_p,
                    local_968.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
    operator_delete(local_968.m_desc._M_dataplus._M_p,
                    local_968.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT53(local_3f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3f0.field_2._M_local_buf[2],
                                      local_3f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT53(local_3d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3d0.field_2._M_local_buf[2],
                                      local_3d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                             local_450.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
    operator_delete(local_900.m_unit._M_dataplus._M_p,
                    local_900.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
    operator_delete(local_900.m_desc._M_dataplus._M_p,
                    local_900.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT53(local_3b0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3b0.field_2._M_local_buf[2],
                                      local_3b0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,
                    CONCAT17(local_af0.field_2._M_local_buf[7],
                             CONCAT16(local_af0.field_2._M_local_buf[6],
                                      CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                               local_af0.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
    operator_delete(local_b70._M_dataplus._M_p,(ulong)(local_b70.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p,
                    CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_ad0.field_2._M_local_buf[5],
                                      CONCAT14(local_ad0.field_2._M_local_buf[4],
                                               local_ad0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p,
                    CONCAT17(local_b10.field_2._M_local_buf[7],
                             CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_b10.field_2._M_local_buf[2],
                                               local_b10.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  uVar5 = local_5a8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p,(ulong)(local_b50.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._0_8_ != &local_588) {
    operator_delete((void *)local_598._0_8_,
                    CONCAT35(local_588._M_allocated_capacity._5_3_,
                             local_588._M_allocated_capacity._0_5_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_desc._M_dataplus._M_p != &local_610.m_desc.field_2) {
    operator_delete(local_610.m_desc._M_dataplus._M_p,
                    local_610.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  lVar21 = *(long *)uVar5;
  if (0 < (int)((ulong)(*(long *)(uVar5 + 8) - lVar21) >> 6)) {
    lVar24 = 0;
    lVar19 = 0;
    uVar5 = local_5a8._0_8_;
    do {
      local_ab0 = CONCAT44(local_ab0._4_4_,(float)*(ulong *)(lVar21 + 0x38 + lVar24));
      local_a3c = (float)*(int *)(lVar21 + 8 + lVar24) * local_1bc.coefficient + local_1bc.offset;
      local_6f0 = (pointer)0x0;
      aStack_6e8._M_allocated_capacity = 0;
      aStack_6e8._8_8_ = 0;
      local_6f8 = (undefined1  [8])log;
      pSVar13 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_6f8,*(int *)(lVar21 + 8 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + 0x30 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + 0x28 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + 0x10 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + 0x18 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,*(int *)(*(long *)uVar5 + 0x20 + lVar24));
      pSVar13 = tcu::SampleBuilder::operator<<(pSVar13,(float)local_ab0 - local_a3c);
      tcu::SampleBuilder::operator<<(pSVar13,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_6f0 != (pointer)0x0) {
        operator_delete(local_6f0,aStack_6e8._8_8_ - (long)local_6f0);
      }
      lVar19 = lVar19 + 1;
      lVar21 = *(long *)local_5a8._0_8_;
      lVar24 = lVar24 + 0x40;
    } while (lVar19 < (int)((ulong)(*(long *)(local_5a8._0_8_ + 8) - lVar21) >> 6));
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_388._M_dataplus._M_p);
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_168.field_2._8_8_ = 0;
  local_168._M_dataplus._M_p = (pointer)0x0;
  local_168._M_string_length = 0;
  lVar21 = *(long *)local_5a8._0_8_;
  uVar12 = (uint)((ulong)(*(long *)(local_5a8._0_8_ + 8) - lVar21) >> 6);
  if ((int)uVar12 < 1) {
    local_178._0_4_ = 0;
    fVar28 = 0.0;
  }
  else {
    uVar17 = (ulong)(uVar12 & 0x7fffffff);
    piVar18 = (int *)(lVar21 + 4);
    local_178._0_4_ = 0;
    fVar28 = 0.0;
    do {
      if ((fVar28 == 0.0) || (*piVar18 < (int)fVar28)) {
        fVar28 = (float)*piVar18;
      }
      if ((local_178._0_4_ == 0) || ((int)local_178._0_4_ < *piVar18)) {
        local_178._0_4_ = *piVar18;
      }
      piVar18 = piVar18 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  local_a3c = fVar28;
  if (0 < (int)uVar12) {
    local_390 = (string *)CONCAT44(local_390._4_4_,(float)(local_178._0_4_ - (int)fVar28));
    lVar24 = 0;
    lVar19 = 0;
    plVar23 = (long *)local_5a8._0_8_;
    do {
      puVar25 = (undefined8 *)(lVar21 + lVar24);
      local_ab0 = lVar19;
      fVar27 = floorf(((float)(*(int *)(lVar21 + 4 + lVar24) - (int)fVar28) / local_390._0_4_) * 4.0
                     );
      uVar12 = (uint)fVar27;
      if (2 < (int)uVar12) {
        uVar12 = 3;
      }
      uVar17 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar17 = 0;
      }
      uVar17 = uVar17 * 3 & 0xffffffff;
      pcVar2 = (pointer)(&local_168._M_string_length)[uVar17];
      if (pcVar2 == *(pointer *)((long)&local_168.field_2 + uVar17 * 8)) {
        local_e8._0_8_ = &local_168._M_dataplus + uVar17;
        __src = (&local_168._M_dataplus)[uVar17]._M_p;
        __n = (long)pcVar2 - (long)__src;
        if (__n == 0x7fffffffffffffc0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar20 = (long)__n >> 6;
        uVar17 = uVar20;
        if (pcVar2 == __src) {
          uVar17 = 1;
        }
        uVar22 = uVar17 + uVar20;
        if (0x1fffffffffffffe < uVar22) {
          uVar22 = 0x1ffffffffffffff;
        }
        if (CARRY8(uVar17,uVar20)) {
          uVar22 = 0x1ffffffffffffff;
        }
        if (uVar22 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          local_1e8 = __src;
          pvVar14 = operator_new(uVar22 << 6);
          __src = local_1e8;
        }
        lVar21 = uVar20 * 0x40;
        uVar7 = *puVar25;
        uVar8 = puVar25[1];
        uVar9 = puVar25[2];
        uVar10 = puVar25[3];
        uVar5 = puVar25[4];
        uVar6 = puVar25[5];
        uVar11 = puVar25[7];
        puVar1 = (undefined8 *)((long)pvVar14 + lVar21 + 0x30);
        *puVar1 = puVar25[6];
        puVar1[1] = uVar11;
        puVar25 = (undefined8 *)((long)pvVar14 + lVar21 + 0x20);
        *puVar25 = uVar5;
        puVar25[1] = uVar6;
        puVar25 = (undefined8 *)((long)pvVar14 + lVar21 + 0x10);
        *puVar25 = uVar9;
        puVar25[1] = uVar10;
        *(undefined8 *)((long)pvVar14 + lVar21) = uVar7;
        ((undefined8 *)((long)pvVar14 + lVar21))[1] = uVar8;
        if (0 < (long)__n) {
          memmove(pvVar14,__src,__n);
        }
        fVar28 = local_a3c;
        uVar5 = local_e8._0_8_;
        if (__src != (pointer)0x0) {
          operator_delete(__src,*(long *)(local_e8._0_8_ + 0x10) - (long)__src);
        }
        *(void **)uVar5 = pvVar14;
        *(size_t *)(uVar5 + 8) = __n + 0x40 + (long)pvVar14;
        *(void **)(uVar5 + 0x10) = (void *)(uVar22 * 0x40 + (long)pvVar14);
        plVar23 = (long *)local_5a8._0_8_;
      }
      else {
        uVar5 = *puVar25;
        uVar6 = puVar25[1];
        uVar7 = puVar25[2];
        uVar8 = puVar25[3];
        uVar9 = puVar25[4];
        uVar10 = puVar25[5];
        uVar11 = puVar25[7];
        *(undefined8 *)(pcVar2 + 0x30) = puVar25[6];
        *(undefined8 *)(pcVar2 + 0x38) = uVar11;
        *(undefined8 *)(pcVar2 + 0x20) = uVar9;
        *(undefined8 *)(pcVar2 + 0x28) = uVar10;
        *(undefined8 *)(pcVar2 + 0x10) = uVar7;
        *(undefined8 *)(pcVar2 + 0x18) = uVar8;
        *(undefined8 *)pcVar2 = uVar5;
        *(undefined8 *)(pcVar2 + 8) = uVar6;
        (&local_168._M_string_length)[uVar17] = (&local_168._M_string_length)[uVar17] + 0x40;
      }
      lVar19 = local_ab0 + 1;
      lVar21 = *plVar23;
      lVar24 = lVar24 + 0x40;
    } while (lVar19 < (int)((ulong)(plVar23[1] - lVar21) >> 6));
  }
  local_ab0 = CONCAT44(local_ab0._4_4_,(float)(local_178._0_4_ - (int)fVar28));
  lVar21 = 0;
  psVar16 = &local_168;
  do {
    if ((((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
           *)&psVar16->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start !=
        (pointer)psVar16->_M_string_length) {
      local_390 = psVar16;
      calculateSampleStatistics
                ((MapCallStatistics *)local_6f8,&local_1bc,
                 (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                  *)psVar16);
      local_aa8._0_8_ = &local_a98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"BufferSizeRange","");
      local_a38.m_name._M_dataplus._M_p = (pointer)&local_a38.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a38,"Transfer performance with buffer size in range [","");
      (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                (&local_900.m_name,
                 (_anonymous_namespace_ *)
                 (ulong)(uint)((int)((float)(int)lVar21 * 0.25 * (float)local_ab0) + (int)local_a3c)
                 ,numBytes);
      auVar32 = std::__cxx11::string::append((char *)&local_900);
      (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                (&local_9d0.m_name,
                 (_anonymous_namespace_ *)
                 (ulong)(uint)((int)((float)((int)lVar21 + 1) * 0.25 * (float)local_ab0) +
                              (int)local_a3c),auVar32._8_4_);
      puVar15 = (ulong *)std::__cxx11::string::append((char *)&local_9d0);
      puVar15 = (ulong *)std::__cxx11::string::_M_append(auVar32._0_8_,*puVar15);
      psVar16 = (string *)std::__cxx11::string::_M_append((char *)&local_a38,*puVar15);
      tcu::ScopedLogSection::ScopedLogSection(&local_180,log,(string *)local_aa8,psVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
      local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x615270614d;
      local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x676e;
      local_898.m_name.field_2._M_local_buf[7] = 'e';
      local_898.m_name.field_2._M_local_buf[8] = 'M';
      local_898.m_name.field_2._9_2_ = 0x6e69;
      local_898.m_name._M_string_length = 0xb;
      local_898.m_name.field_2._M_local_buf[0xb] = '\0';
      local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"MapRange: Min time","");
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_610.m_name._M_string_length = 2;
      local_610.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name
                 ,QP_KEY_TAG_TIME,(float)local_6f8._0_4_);
      tcu::TestLog::writeFloat
                (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
                 local_a48,local_a44);
      local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
      local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x5270614d;
      local_830.m_name.field_2._M_local_buf[4] = 'a';
      local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x676e;
      local_830.m_name.field_2._M_local_buf[7] = 'e';
      local_830.m_name.field_2._M_local_buf[8] = 'M';
      local_830.m_name.field_2._9_2_ = 0x7861;
      local_830.m_name._M_string_length = 0xb;
      local_830.m_name.field_2._M_local_buf[0xb] = '\0';
      local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
      local_900.m_name._M_dataplus._M_p = (char *)0x12;
      local_760.m_name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_760,(ulong)&local_900);
      local_760.m_name.field_2._M_allocated_capacity._0_4_ =
           SUB84(local_900.m_name._M_dataplus._M_p,0);
      local_760.m_name.field_2._M_allocated_capacity._4_4_ =
           (undefined4)((ulong)local_900.m_name._M_dataplus._M_p >> 0x20);
      builtin_strncpy(local_760.m_name._M_dataplus._M_p,"MapRange: Max time",0x12);
      local_760.m_name._M_string_length = (size_type)local_900.m_name._M_dataplus._M_p;
      local_760.m_name._M_dataplus._M_p[(long)local_900.m_name._M_dataplus._M_p] = '\0';
      local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
      local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_7c8.m_name._M_string_length = 2;
      local_7c8.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
                 (float)local_6f8._4_4_);
      tcu::TestLog::writeFloat
                (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
                 local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
      local_598._0_8_ = &local_588;
      local_588._8_2_ = 0x694d;
      local_588._M_local_buf[10] = 'n';
      local_588._M_local_buf[0xb] = '9';
      local_588._M_local_buf[0xc] = '0';
      local_588._M_allocated_capacity._0_5_ = 0x615270614d;
      local_588._M_allocated_capacity._5_3_ = 0x65676e;
      local_598._8_8_ = 0xd;
      local_588._M_local_buf[0xd] = '\0';
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      local_9d0.m_name._M_dataplus._M_p = (char *)0x16;
      local_b50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b50,(ulong)&local_9d0);
      local_b50.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b50._M_dataplus._M_p,"MapRange: 90%-Min time",0x16);
      local_b50._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
      local_b50._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      local_b10.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_b10._M_string_length = 2;
      local_b10.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_900,(string *)local_598,&local_b50,&local_b10,QP_KEY_TAG_TIME,
                 local_6f0._4_4_);
      tcu::TestLog::writeFloat
                (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
                 local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      local_ad0.field_2._8_2_ = 0x614d;
      local_ad0.field_2._M_local_buf[10] = 'x';
      local_ad0.field_2._11_2_ = 0x3039;
      local_ad0.field_2._M_allocated_capacity._0_4_ = 0x5270614d;
      local_ad0.field_2._M_local_buf[4] = 'a';
      local_ad0.field_2._M_local_buf[5] = 'n';
      local_ad0.field_2._M_allocated_capacity._6_2_ = 0x6567;
      local_ad0._M_string_length = 0xd;
      local_ad0.field_2._M_local_buf[0xd] = '\0';
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      local_968.m_name._M_dataplus._M_p = (char *)0x16;
      local_b70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b70,(ulong)&local_968);
      local_b70.field_2._M_allocated_capacity = (size_type)local_968.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b70._M_dataplus._M_p,"MapRange: 90%-Max time",0x16);
      local_b70._M_string_length = (size_type)local_968.m_name._M_dataplus._M_p;
      local_b70._M_dataplus._M_p[(long)local_968.m_name._M_dataplus._M_p] = '\0';
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      local_b30._M_string_length = 2;
      local_b30.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_9d0,&local_ad0,&local_b70,&local_b30,QP_KEY_TAG_TIME,
                 (float)aStack_6e8._M_allocated_capacity._0_4_);
      tcu::TestLog::writeFloat
                (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
                 local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      local_af0.field_2._M_local_buf[0xb] = 'i';
      local_af0.field_2._12_2_ = 0x6e61;
      local_af0.field_2._M_allocated_capacity._0_2_ = 0x614d;
      local_af0.field_2._M_allocated_capacity._2_4_ = 0x6e615270;
      local_af0.field_2._M_local_buf[6] = 'g';
      local_af0.field_2._7_4_ = 0x64654d65;
      local_af0._M_string_length = 0xe;
      local_af0.field_2._M_local_buf[0xe] = '\0';
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      local_bb0._M_dataplus._M_p = (pointer)0x15;
      local_b90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)&local_bb0);
      local_b90.field_2._M_allocated_capacity = (size_type)local_bb0._M_dataplus._M_p;
      builtin_strncpy(local_b90._M_dataplus._M_p,"MapRange: Median time",0x15);
      local_b90._M_string_length = (size_type)local_bb0._M_dataplus._M_p;
      local_b90._M_dataplus._M_p[(long)local_bb0._M_dataplus._M_p] = '\0';
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      local_bb0._M_string_length = 2;
      local_bb0.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_968,&local_af0,&local_b90,&local_bb0,QP_KEY_TAG_TIME,(float)local_6f0);
      tcu::TestLog::writeFloat
                (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
                 local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
        operator_delete(local_968.m_unit._M_dataplus._M_p,
                        local_968.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
        operator_delete(local_968.m_desc._M_dataplus._M_p,
                        local_968.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
        operator_delete(local_968.m_name._M_dataplus._M_p,
                        CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                          local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,
                        CONCAT17(local_af0.field_2._M_local_buf[7],
                                 CONCAT16(local_af0.field_2._M_local_buf[6],
                                          CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                                   local_af0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
        operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                        local_9d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
        operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                        local_9d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,
                        (ulong)(local_b70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,
                        CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_ad0.field_2._M_local_buf[5],
                                          CONCAT14(local_ad0.field_2._M_local_buf[4],
                                                   local_ad0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
        operator_delete(local_900.m_unit._M_dataplus._M_p,
                        local_900.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
        operator_delete(local_900.m_desc._M_dataplus._M_p,
                        local_900.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,
                        CONCAT17(local_b10.field_2._M_local_buf[7],
                                 CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_b10.field_2._M_local_buf[2],
                                                   local_b10.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,
                        (ulong)(local_b50.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,
                        CONCAT35(local_588._M_allocated_capacity._5_3_,
                                 local_588._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
        operator_delete(local_a38.m_unit._M_dataplus._M_p,
                        local_a38.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
        operator_delete(local_a38.m_desc._M_dataplus._M_p,
                        local_a38.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
        operator_delete(local_7c8.m_name._M_dataplus._M_p,
                        CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                                   local_7c8.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
        operator_delete(local_760.m_name._M_dataplus._M_p,
                        CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
        operator_delete(local_830.m_name._M_dataplus._M_p,
                        CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                                   local_830.m_name.field_2._M_allocated_capacity.
                                                   _0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                                   local_610.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
        operator_delete(local_678.m_name._M_dataplus._M_p,
                        CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                                 local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
        operator_delete(local_898.m_name._M_dataplus._M_p,
                        CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                          local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1
                       );
      }
      local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
      local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
      local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694d;
      local_898.m_name.field_2._M_local_buf[7] = 'n';
      local_898.m_name._M_string_length = 8;
      local_898.m_name.field_2._M_local_buf[8] = '\0';
      local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
      local_678.m_name.field_2._8_7_ = 0x656d6974206e69;
      local_678.m_name.field_2._M_allocated_capacity._0_7_ = 0x203a70616d6e55;
      local_678.m_name.field_2._M_local_buf[7] = 'M';
      local_678.m_name._M_string_length = 0xf;
      local_678.m_name.field_2._M_local_buf[0xf] = '\0';
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_610.m_name._M_string_length = 2;
      local_610.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name
                 ,QP_KEY_TAG_TIME,(float)aStack_6e8._M_allocated_capacity._4_4_);
      tcu::TestLog::writeFloat
                (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
                 local_a48,local_a44);
      local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
      local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
      local_830.m_name.field_2._M_local_buf[4] = 'p';
      local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x614d;
      local_830.m_name.field_2._M_local_buf[7] = 'x';
      local_830.m_name._M_string_length = 8;
      local_830.m_name.field_2._M_local_buf[8] = '\0';
      local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
      local_760.m_name.field_2._8_7_ = 0x656d6974207861;
      local_760.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
      local_760.m_name.field_2._M_allocated_capacity._4_4_ = 0x4d203a70;
      local_760.m_name._M_string_length = 0xf;
      local_760.m_name.field_2._M_local_buf[0xf] = '\0';
      local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
      local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_7c8.m_name._M_string_length = 2;
      local_7c8.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
                 (float)aStack_6e8._8_4_);
      tcu::TestLog::writeFloat
                (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
                 local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
      local_598._0_8_ = &local_588;
      local_588._M_allocated_capacity._0_5_ = 0x70616d6e55;
      local_588._M_allocated_capacity._5_3_ = 0x6e694d;
      local_588._8_2_ = 0x3039;
      local_598._8_8_ = 10;
      local_588._M_local_buf[10] = '\0';
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      local_9d0.m_name._M_dataplus._M_p = (char *)0x13;
      local_b50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b50,(ulong)&local_9d0);
      local_b50.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b50._M_dataplus._M_p,"Unmap: 90%-Min time",0x13);
      local_b50._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
      local_b50._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      local_b10.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_b10._M_string_length = 2;
      local_b10.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_900,(string *)local_598,&local_b50,&local_b10,QP_KEY_TAG_TIME,local_6d8);
      tcu::TestLog::writeFloat
                (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
                 local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      local_ad0.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
      local_ad0.field_2._M_local_buf[4] = 'p';
      local_ad0.field_2._M_local_buf[5] = 'M';
      local_ad0.field_2._M_allocated_capacity._6_2_ = 0x7861;
      local_ad0.field_2._8_2_ = 0x3039;
      local_ad0._M_string_length = 10;
      local_ad0.field_2._M_local_buf[10] = '\0';
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      local_968.m_name._M_dataplus._M_p = (char *)0x13;
      local_b70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b70,(ulong)&local_968);
      local_b70.field_2._M_allocated_capacity = (size_type)local_968.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b70._M_dataplus._M_p,"Unmap: 90%-Max time",0x13);
      local_b70._M_string_length = (size_type)local_968.m_name._M_dataplus._M_p;
      local_b70._M_dataplus._M_p[(long)local_968.m_name._M_dataplus._M_p] = '\0';
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      local_b30._M_string_length = 2;
      local_b30.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_9d0,&local_ad0,&local_b70,&local_b30,QP_KEY_TAG_TIME,fStack_6d4);
      tcu::TestLog::writeFloat
                (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
                 local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      local_af0.field_2._M_allocated_capacity._0_2_ = 0x6e55;
      local_af0.field_2._M_allocated_capacity._2_4_ = 0x4d70616d;
      local_af0.field_2._M_local_buf[6] = 'e';
      local_af0.field_2._7_4_ = 0x6e616964;
      local_af0._M_string_length = 0xb;
      local_af0.field_2._M_local_buf[0xb] = '\0';
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      local_bb0._M_dataplus._M_p = (pointer)0x12;
      local_b90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)&local_bb0);
      local_b90.field_2._M_allocated_capacity = (size_type)local_bb0._M_dataplus._M_p;
      builtin_strncpy(local_b90._M_dataplus._M_p,"Unmap: Median time",0x12);
      local_b90._M_string_length = (size_type)local_bb0._M_dataplus._M_p;
      local_b90._M_dataplus._M_p[(long)local_bb0._M_dataplus._M_p] = '\0';
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      local_bb0._M_string_length = 2;
      local_bb0.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_968,&local_af0,&local_b90,&local_bb0,QP_KEY_TAG_TIME,
                 (float)aStack_6e8._12_4_);
      tcu::TestLog::writeFloat
                (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
                 local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
        operator_delete(local_968.m_unit._M_dataplus._M_p,
                        local_968.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
        operator_delete(local_968.m_desc._M_dataplus._M_p,
                        local_968.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
        operator_delete(local_968.m_name._M_dataplus._M_p,
                        CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                          local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,
                        CONCAT17(local_af0.field_2._M_local_buf[7],
                                 CONCAT16(local_af0.field_2._M_local_buf[6],
                                          CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                                   local_af0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
        operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                        local_9d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
        operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                        local_9d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,
                        (ulong)(local_b70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,
                        CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_ad0.field_2._M_local_buf[5],
                                          CONCAT14(local_ad0.field_2._M_local_buf[4],
                                                   local_ad0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
        operator_delete(local_900.m_unit._M_dataplus._M_p,
                        local_900.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
        operator_delete(local_900.m_desc._M_dataplus._M_p,
                        local_900.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,
                        CONCAT17(local_b10.field_2._M_local_buf[7],
                                 CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_b10.field_2._M_local_buf[2],
                                                   local_b10.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,
                        (ulong)(local_b50.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,
                        CONCAT35(local_588._M_allocated_capacity._5_3_,
                                 local_588._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
        operator_delete(local_a38.m_unit._M_dataplus._M_p,
                        local_a38.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
        operator_delete(local_a38.m_desc._M_dataplus._M_p,
                        local_a38.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
        operator_delete(local_7c8.m_name._M_dataplus._M_p,
                        CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                                   local_7c8.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
        operator_delete(local_760.m_name._M_dataplus._M_p,
                        CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
        operator_delete(local_830.m_name._M_dataplus._M_p,
                        CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                                   local_830.m_name.field_2._M_allocated_capacity.
                                                   _0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                                   local_610.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
        operator_delete(local_678.m_name._M_dataplus._M_p,
                        CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                                 local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
        operator_delete(local_898.m_name._M_dataplus._M_p,
                        CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                          local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1
                       );
      }
      local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
      local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
      local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694d;
      local_898.m_name.field_2._M_local_buf[7] = 'n';
      local_898.m_name._M_string_length = 8;
      local_898.m_name.field_2._M_local_buf[8] = '\0';
      local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
      local_678.m_name.field_2._8_7_ = 0x656d6974206e69;
      local_678.m_name.field_2._M_allocated_capacity._0_7_ = 0x203a6574697257;
      local_678.m_name.field_2._M_local_buf[7] = 'M';
      local_678.m_name._M_string_length = 0xf;
      local_678.m_name.field_2._M_local_buf[0xf] = '\0';
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_610.m_name._M_string_length = 2;
      local_610.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name
                 ,QP_KEY_TAG_TIME,local_6d0);
      tcu::TestLog::writeFloat
                (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
                 local_a48,local_a44);
      local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
      local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
      local_830.m_name.field_2._M_local_buf[4] = 'e';
      local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x614d;
      local_830.m_name.field_2._M_local_buf[7] = 'x';
      local_830.m_name._M_string_length = 8;
      local_830.m_name.field_2._M_local_buf[8] = '\0';
      local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
      local_760.m_name.field_2._8_7_ = 0x656d6974207861;
      local_760.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
      local_760.m_name.field_2._M_allocated_capacity._4_4_ = 0x4d203a65;
      local_760.m_name._M_string_length = 0xf;
      local_760.m_name.field_2._M_local_buf[0xf] = '\0';
      local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
      local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_7c8.m_name._M_string_length = 2;
      local_7c8.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
                 local_6cc);
      tcu::TestLog::writeFloat
                (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
                 local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
      local_598._0_8_ = &local_588;
      local_588._M_allocated_capacity._0_5_ = 0x6574697257;
      local_588._M_allocated_capacity._5_3_ = 0x6e694d;
      local_588._8_2_ = 0x3039;
      local_598._8_8_ = 10;
      local_588._M_local_buf[10] = '\0';
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      local_9d0.m_name._M_dataplus._M_p = (char *)0x13;
      local_b50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b50,(ulong)&local_9d0);
      local_b50.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b50._M_dataplus._M_p,"Write: 90%-Min time",0x13);
      local_b50._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
      local_b50._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      local_b10.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_b10._M_string_length = 2;
      local_b10.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_900,(string *)local_598,&local_b50,&local_b10,QP_KEY_TAG_TIME,
                 (float)local_6c8._M_allocated_capacity._4_4_);
      tcu::TestLog::writeFloat
                (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
                 local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      local_ad0.field_2._M_allocated_capacity._0_4_ = 0x74697257;
      local_ad0.field_2._M_local_buf[4] = 'e';
      local_ad0.field_2._M_local_buf[5] = 'M';
      local_ad0.field_2._M_allocated_capacity._6_2_ = 0x7861;
      local_ad0.field_2._8_2_ = 0x3039;
      local_ad0._M_string_length = 10;
      local_ad0.field_2._M_local_buf[10] = '\0';
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      local_968.m_name._M_dataplus._M_p = (char *)0x13;
      local_b70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b70,(ulong)&local_968);
      local_b70.field_2._M_allocated_capacity = (size_type)local_968.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b70._M_dataplus._M_p,"Write: 90%-Max time",0x13);
      local_b70._M_string_length = (size_type)local_968.m_name._M_dataplus._M_p;
      local_b70._M_dataplus._M_p[(long)local_968.m_name._M_dataplus._M_p] = '\0';
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      local_b30._M_string_length = 2;
      local_b30.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_9d0,&local_ad0,&local_b70,&local_b30,QP_KEY_TAG_TIME,(float)local_6c8._8_4_)
      ;
      tcu::TestLog::writeFloat
                (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
                 local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      local_af0.field_2._M_allocated_capacity._0_2_ = 0x7257;
      local_af0.field_2._M_allocated_capacity._2_4_ = 0x4d657469;
      local_af0.field_2._M_local_buf[6] = 'e';
      local_af0.field_2._7_4_ = 0x6e616964;
      local_af0._M_string_length = 0xb;
      local_af0.field_2._M_local_buf[0xb] = '\0';
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      local_bb0._M_dataplus._M_p = (pointer)0x12;
      local_b90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)&local_bb0);
      local_b90.field_2._M_allocated_capacity = (size_type)local_bb0._M_dataplus._M_p;
      builtin_strncpy(local_b90._M_dataplus._M_p,"Write: Median time",0x12);
      local_b90._M_string_length = (size_type)local_bb0._M_dataplus._M_p;
      local_b90._M_dataplus._M_p[(long)local_bb0._M_dataplus._M_p] = '\0';
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      local_bb0._M_string_length = 2;
      local_bb0.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_968,&local_af0,&local_b90,&local_bb0,QP_KEY_TAG_TIME,
                 (float)local_6c8._M_allocated_capacity._0_4_);
      tcu::TestLog::writeFloat
                (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
                 local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
        operator_delete(local_968.m_unit._M_dataplus._M_p,
                        local_968.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
        operator_delete(local_968.m_desc._M_dataplus._M_p,
                        local_968.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
        operator_delete(local_968.m_name._M_dataplus._M_p,
                        CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                          local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,
                        CONCAT17(local_af0.field_2._M_local_buf[7],
                                 CONCAT16(local_af0.field_2._M_local_buf[6],
                                          CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                                   local_af0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
        operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                        local_9d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
        operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                        local_9d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,
                        (ulong)(local_b70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,
                        CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_ad0.field_2._M_local_buf[5],
                                          CONCAT14(local_ad0.field_2._M_local_buf[4],
                                                   local_ad0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
        operator_delete(local_900.m_unit._M_dataplus._M_p,
                        local_900.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
        operator_delete(local_900.m_desc._M_dataplus._M_p,
                        local_900.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,
                        CONCAT17(local_b10.field_2._M_local_buf[7],
                                 CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_b10.field_2._M_local_buf[2],
                                                   local_b10.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,
                        (ulong)(local_b50.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,
                        CONCAT35(local_588._M_allocated_capacity._5_3_,
                                 local_588._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
        operator_delete(local_a38.m_unit._M_dataplus._M_p,
                        local_a38.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
        operator_delete(local_a38.m_desc._M_dataplus._M_p,
                        local_a38.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
        operator_delete(local_7c8.m_name._M_dataplus._M_p,
                        CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                                   local_7c8.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
        operator_delete(local_760.m_name._M_dataplus._M_p,
                        CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
        operator_delete(local_830.m_name._M_dataplus._M_p,
                        CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                                   local_830.m_name.field_2._M_allocated_capacity.
                                                   _0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                                   local_610.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
        operator_delete(local_678.m_name._M_dataplus._M_p,
                        CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                                 local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
        operator_delete(local_898.m_name._M_dataplus._M_p,
                        CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                          local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1
                       );
      }
      local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
      local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x636f6c6c41;
      local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694d;
      local_898.m_name.field_2._M_local_buf[7] = 'n';
      local_898.m_name._M_string_length = 8;
      local_898.m_name.field_2._M_local_buf[8] = '\0';
      local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
      local_678.m_name.field_2._8_7_ = 0x656d6974206e69;
      local_678.m_name.field_2._M_allocated_capacity._0_7_ = 0x203a636f6c6c41;
      local_678.m_name.field_2._M_local_buf[7] = 'M';
      local_678.m_name._M_string_length = 0xf;
      local_678.m_name.field_2._M_local_buf[0xf] = '\0';
      local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
      local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_610.m_name._M_string_length = 2;
      local_610.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name
                 ,QP_KEY_TAG_TIME,(float)local_6c8._12_4_);
      tcu::TestLog::writeFloat
                (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
                 local_a48,local_a44);
      local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
      local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x6f6c6c41;
      local_830.m_name.field_2._M_local_buf[4] = 'c';
      local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x614d;
      local_830.m_name.field_2._M_local_buf[7] = 'x';
      local_830.m_name._M_string_length = 8;
      local_830.m_name.field_2._M_local_buf[8] = '\0';
      local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
      local_760.m_name.field_2._8_7_ = 0x656d6974207861;
      local_760.m_name.field_2._M_allocated_capacity._0_4_ = 0x6f6c6c41;
      local_760.m_name.field_2._M_allocated_capacity._4_4_ = 0x4d203a63;
      local_760.m_name._M_string_length = 0xf;
      local_760.m_name.field_2._M_local_buf[0xf] = '\0';
      local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
      local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_7c8.m_name._M_string_length = 2;
      local_7c8.m_name.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
                 local_6b8);
      tcu::TestLog::writeFloat
                (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
                 local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
      local_598._0_8_ = &local_588;
      local_588._M_allocated_capacity._0_5_ = 0x636f6c6c41;
      local_588._M_allocated_capacity._5_3_ = 0x6e694d;
      local_588._8_2_ = 0x3039;
      local_598._8_8_ = 10;
      local_588._M_local_buf[10] = '\0';
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      local_9d0.m_name._M_dataplus._M_p = (char *)0x13;
      local_b50._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b50,(ulong)&local_9d0);
      local_b50.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b50._M_dataplus._M_p,"Alloc: 90%-Min time",0x13);
      local_b50._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
      local_b50._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      local_b10.field_2._M_allocated_capacity._0_2_ = 0x7375;
      local_b10._M_string_length = 2;
      local_b10.field_2._M_local_buf[2] = '\0';
      tcu::LogNumber<float>::LogNumber
                (&local_900,(string *)local_598,&local_b50,&local_b10,QP_KEY_TAG_TIME,local_6b0);
      tcu::TestLog::writeFloat
                (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
                 local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      local_ad0.field_2._M_allocated_capacity._0_4_ = 0x6f6c6c41;
      local_ad0.field_2._M_local_buf[4] = 'c';
      local_ad0.field_2._M_local_buf[5] = 'M';
      local_ad0.field_2._M_allocated_capacity._6_2_ = 0x7861;
      local_ad0.field_2._8_2_ = 0x3039;
      local_ad0._M_string_length = 10;
      local_ad0.field_2._M_local_buf[10] = '\0';
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      local_968.m_name._M_dataplus._M_p = (char *)0x13;
      local_b70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b70,(ulong)&local_968);
      local_b70.field_2._M_allocated_capacity = (size_type)local_968.m_name._M_dataplus._M_p;
      builtin_strncpy(local_b70._M_dataplus._M_p,"Alloc: 90%-Max time",0x13);
      local_b70._M_string_length = (size_type)local_968.m_name._M_dataplus._M_p;
      local_b70._M_dataplus._M_p[(long)local_968.m_name._M_dataplus._M_p] = '\0';
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      local_b30._M_string_length = 2;
      local_b30.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_9d0,&local_ad0,&local_b70,&local_b30,QP_KEY_TAG_TIME,local_6ac);
      tcu::TestLog::writeFloat
                (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
                 local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      local_af0.field_2._M_allocated_capacity._0_2_ = 0x6c41;
      local_af0.field_2._M_allocated_capacity._2_4_ = 0x4d636f6c;
      local_af0.field_2._M_local_buf[6] = 'e';
      local_af0.field_2._7_4_ = 0x6e616964;
      local_af0._M_string_length = 0xb;
      local_af0.field_2._M_local_buf[0xb] = '\0';
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      local_bb0._M_dataplus._M_p = (pointer)0x12;
      local_b90._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)&local_bb0);
      local_b90.field_2._M_allocated_capacity = (size_type)local_bb0._M_dataplus._M_p;
      builtin_strncpy(local_b90._M_dataplus._M_p,"Alloc: Median time",0x12);
      local_b90._M_string_length = (size_type)local_bb0._M_dataplus._M_p;
      local_b90._M_dataplus._M_p[(long)local_bb0._M_dataplus._M_p] = '\0';
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      local_bb0._M_string_length = 2;
      local_bb0.field_2._M_allocated_capacity._0_3_ = 0x7375;
      tcu::LogNumber<float>::LogNumber
                (&local_968,&local_af0,&local_b90,&local_bb0,QP_KEY_TAG_TIME,fStack_6b4);
      tcu::TestLog::writeFloat
                (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
                 local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
        operator_delete(local_968.m_unit._M_dataplus._M_p,
                        local_968.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
        operator_delete(local_968.m_desc._M_dataplus._M_p,
                        local_968.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
        operator_delete(local_968.m_name._M_dataplus._M_p,
                        CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                          local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,
                        CONCAT17(local_af0.field_2._M_local_buf[7],
                                 CONCAT16(local_af0.field_2._M_local_buf[6],
                                          CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                                   local_af0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
        operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                        local_9d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
        operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                        local_9d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,
                        (ulong)(local_b70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,
                        CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_ad0.field_2._M_local_buf[5],
                                          CONCAT14(local_ad0.field_2._M_local_buf[4],
                                                   local_ad0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
        operator_delete(local_900.m_unit._M_dataplus._M_p,
                        local_900.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
        operator_delete(local_900.m_desc._M_dataplus._M_p,
                        local_900.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,
                        CONCAT17(local_b10.field_2._M_local_buf[7],
                                 CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_b10.field_2._M_local_buf[2],
                                                   local_b10.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,
                        (ulong)(local_b50.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,
                        CONCAT35(local_588._M_allocated_capacity._5_3_,
                                 local_588._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
        operator_delete(local_a38.m_unit._M_dataplus._M_p,
                        local_a38.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
        operator_delete(local_a38.m_desc._M_dataplus._M_p,
                        local_a38.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
        operator_delete(local_7c8.m_name._M_dataplus._M_p,
                        CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                                   local_7c8.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
        operator_delete(local_760.m_name._M_dataplus._M_p,
                        CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
        operator_delete(local_830.m_name._M_dataplus._M_p,
                        CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                                   local_830.m_name.field_2._M_allocated_capacity.
                                                   _0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                                   local_610.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
        operator_delete(local_678.m_name._M_dataplus._M_p,
                        CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                                 local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
        operator_delete(local_898.m_name._M_dataplus._M_p,
                        CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                          local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1
                       );
      }
      local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"Min","");
      local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"Total: Min time","");
      local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"us","");
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_aa8,&local_b50,&local_b10,&local_ad0,QP_KEY_TAG_TIME,
                 (float)local_6a8._M_allocated_capacity._0_4_);
      tcu::TestLog::writeFloat
                (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
                 local_a48,local_a44);
      local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"Max","");
      local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"Total: Max time","");
      local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_a38,&local_b70,&local_b30,&local_af0,QP_KEY_TAG_TIME,
                 (float)local_6a8._M_allocated_capacity._4_4_);
      tcu::TestLog::writeFloat
                (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
                 local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
      local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"Min90","");
      local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb0,"Total: 90%-Min time","")
      ;
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_900,&local_b90,&local_bb0,&local_3b0,QP_KEY_TAG_TIME,(float)local_6a8._12_4_
                );
      tcu::TestLog::writeFloat
                (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
                 local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Max90","");
      local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Total: 90%-Max time","")
      ;
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_9d0,&local_450,&local_470,&local_3d0,QP_KEY_TAG_TIME,local_698);
      tcu::TestLog::writeFloat
                (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
                 local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"Median","");
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"Total: Median time","");
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_968,&local_490,&local_4b0,&local_3f0,QP_KEY_TAG_TIME,(float)local_6a8._8_4_)
      ;
      tcu::TestLog::writeFloat
                (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
                 local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"MedianTransfer","");
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_4f0,"Median transfer rate","");
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"MB / s","");
      tcu::LogNumber<float>::LogNumber
                (&local_898,&local_4d0,&local_4f0,&local_410,QP_KEY_TAG_PERFORMANCE,
                 local_694 * 0.0009765625 * 0.0009765625);
      tcu::TestLog::writeFloat
                (log,local_898.m_name._M_dataplus._M_p,local_898.m_desc._M_dataplus._M_p,
                 local_898.m_unit._M_dataplus._M_p,local_898.m_tag,local_898.m_value);
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"MaxDiff","");
      local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_530,"Max difference to approximated","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_678,&local_510,&local_530,&local_430,QP_KEY_TAG_TIME,local_690);
      tcu::TestLog::writeFloat
                (log,local_678.m_name._M_dataplus._M_p,local_678.m_desc._M_dataplus._M_p,
                 local_678.m_unit._M_dataplus._M_p,local_678.m_tag,local_678.m_value);
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Max90Diff","");
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,"90%-Max difference to approximated","");
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_610,&local_388,&local_288,&local_208,QP_KEY_TAG_TIME,local_68c);
      tcu::TestLog::writeFloat
                (log,local_610.m_name._M_dataplus._M_p,local_610.m_desc._M_dataplus._M_p,
                 local_610.m_unit._M_dataplus._M_p,local_610.m_tag,local_610.m_value);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MedianDiff","");
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2c8,"Median difference to approximated","");
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_830,&local_2a8,&local_2c8,&local_228,QP_KEY_TAG_TIME,local_688);
      tcu::TestLog::writeFloat
                (log,local_830.m_name._M_dataplus._M_p,local_830.m_desc._M_dataplus._M_p,
                 local_830.m_unit._M_dataplus._M_p,local_830.m_tag,local_830.m_value);
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"MaxRelDiff","");
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"Max relative difference to approximated","");
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"%","");
      tcu::LogNumber<float>::LogNumber
                (&local_760,&local_2e8,&local_308,&local_248,QP_KEY_TAG_NONE,local_684 * 100.0);
      tcu::TestLog::writeFloat
                (log,local_760.m_name._M_dataplus._M_p,local_760.m_desc._M_dataplus._M_p,
                 local_760.m_unit._M_dataplus._M_p,local_760.m_tag,local_760.m_value);
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Max90RelDiff","");
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"90%-Max relative difference to approximated","");
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"%","");
      tcu::LogNumber<float>::LogNumber
                (&local_7c8,&local_328,&local_348,&local_268,QP_KEY_TAG_NONE,local_680 * 100.0);
      tcu::TestLog::writeFloat
                (log,local_7c8.m_name._M_dataplus._M_p,local_7c8.m_desc._M_dataplus._M_p,
                 local_7c8.m_unit._M_dataplus._M_p,local_7c8.m_tag,local_7c8.m_value);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"MedianRelDiff","");
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"Median relative difference to approximated","");
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"%","");
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_598,&local_368,&local_1a0,&local_108,QP_KEY_TAG_NONE,
                 local_67c * 100.0);
      tcu::TestLog::writeFloat
                (log,(char *)local_598._0_8_,local_578._M_p,local_558._M_p,local_538,local_534);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_p != &local_548) {
        operator_delete(local_558._M_p,local_548._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_p != &local_568) {
        operator_delete(local_578._M_p,local_568._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._0_8_ != &local_588) {
        operator_delete((void *)local_598._0_8_,
                        CONCAT35(local_588._M_allocated_capacity._5_3_,
                                 local_588._M_allocated_capacity._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_unit._M_dataplus._M_p != &local_7c8.m_unit.field_2) {
        operator_delete(local_7c8.m_unit._M_dataplus._M_p,
                        local_7c8.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_desc._M_dataplus._M_p != &local_7c8.m_desc.field_2) {
        operator_delete(local_7c8.m_desc._M_dataplus._M_p,
                        local_7c8.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
        operator_delete(local_7c8.m_name._M_dataplus._M_p,
                        CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                                   local_7c8.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_unit._M_dataplus._M_p != &local_760.m_unit.field_2) {
        operator_delete(local_760.m_unit._M_dataplus._M_p,
                        local_760.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_desc._M_dataplus._M_p != &local_760.m_desc.field_2) {
        operator_delete(local_760.m_desc._M_dataplus._M_p,
                        local_760.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
        operator_delete(local_760.m_name._M_dataplus._M_p,
                        CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_unit._M_dataplus._M_p != &local_830.m_unit.field_2) {
        operator_delete(local_830.m_unit._M_dataplus._M_p,
                        local_830.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_desc._M_dataplus._M_p != &local_830.m_desc.field_2) {
        operator_delete(local_830.m_desc._M_dataplus._M_p,
                        local_830.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
        operator_delete(local_830.m_name._M_dataplus._M_p,
                        CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                          CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                                   local_830.m_name.field_2._M_allocated_capacity.
                                                   _0_4_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_unit._M_dataplus._M_p != &local_610.m_unit.field_2) {
        operator_delete(local_610.m_unit._M_dataplus._M_p,
                        local_610.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_desc._M_dataplus._M_p != &local_610.m_desc.field_2) {
        operator_delete(local_610.m_desc._M_dataplus._M_p,
                        local_610.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
        operator_delete(local_610.m_name._M_dataplus._M_p,
                        CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                                 CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                                   local_610.m_name.field_2._M_allocated_capacity.
                                                   _0_2_))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_unit._M_dataplus._M_p != &local_678.m_unit.field_2) {
        operator_delete(local_678.m_unit._M_dataplus._M_p,
                        local_678.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_desc._M_dataplus._M_p != &local_678.m_desc.field_2) {
        operator_delete(local_678.m_desc._M_dataplus._M_p,
                        local_678.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
        operator_delete(local_678.m_name._M_dataplus._M_p,
                        CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                                 local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,
                        CONCAT53(local_430.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_430.field_2._M_local_buf[2],
                                          local_430.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT17(local_510.field_2._M_local_buf[7],
                                 local_510.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_unit._M_dataplus._M_p != &local_898.m_unit.field_2) {
        operator_delete(local_898.m_unit._M_dataplus._M_p,
                        local_898.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_desc._M_dataplus._M_p != &local_898.m_desc.field_2) {
        operator_delete(local_898.m_desc._M_dataplus._M_p,
                        local_898.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
        operator_delete(local_898.m_name._M_dataplus._M_p,
                        CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                                 CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                          local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,
                        CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_410.field_2._M_local_buf[2],
                                          local_410.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
        operator_delete(local_968.m_unit._M_dataplus._M_p,
                        local_968.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
        operator_delete(local_968.m_desc._M_dataplus._M_p,
                        local_968.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
        operator_delete(local_968.m_name._M_dataplus._M_p,
                        CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                          local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT53(local_3f0.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_3f0.field_2._M_local_buf[2],
                                          local_3f0.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
        operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                        local_9d0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
        operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                        local_9d0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
        operator_delete(local_9d0.m_name._M_dataplus._M_p,
                        local_9d0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT53(local_3d0.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_3d0.field_2._M_local_buf[2],
                                          local_3d0.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,
                        CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                                 local_450.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
        operator_delete(local_900.m_unit._M_dataplus._M_p,
                        local_900.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
        operator_delete(local_900.m_desc._M_dataplus._M_p,
                        local_900.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
        operator_delete(local_900.m_name._M_dataplus._M_p,
                        CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                                 local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,
                        CONCAT53(local_3b0.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_3b0.field_2._M_local_buf[2],
                                          local_3b0.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
        operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
        operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
        operator_delete(local_a38.m_unit._M_dataplus._M_p,
                        local_a38.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
        operator_delete(local_a38.m_desc._M_dataplus._M_p,
                        local_a38.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
        operator_delete(local_a38.m_name._M_dataplus._M_p,
                        local_a38.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
        operator_delete(local_af0._M_dataplus._M_p,
                        CONCAT17(local_af0.field_2._M_local_buf[7],
                                 CONCAT16(local_af0.field_2._M_local_buf[6],
                                          CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                                   local_af0.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
        operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
        operator_delete(local_b70._M_dataplus._M_p,
                        (ulong)(local_b70.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
        operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
        operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_aa8._0_8_ != &local_a98) {
        operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
        operator_delete(local_ad0._M_dataplus._M_p,
                        CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_ad0.field_2._M_local_buf[5],
                                          CONCAT14(local_ad0.field_2._M_local_buf[4],
                                                   local_ad0.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
        operator_delete(local_b10._M_dataplus._M_p,
                        CONCAT17(local_b10.field_2._M_local_buf[7],
                                 CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                          CONCAT12(local_b10.field_2._M_local_buf[2],
                                                   local_b10.field_2._M_allocated_capacity._0_2_)))
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
        operator_delete(local_b50._M_dataplus._M_p,
                        (ulong)(local_b50.field_2._M_allocated_capacity + 1));
      }
      tcu::TestLog::endSection(local_180.m_log);
      psVar16 = local_390;
    }
    lVar21 = lVar21 + 1;
    psVar16 = (string *)((psVar16->field_2)._M_local_buf + 8);
  } while (lVar21 != 4);
  lVar21 = 0x60;
  do {
    pvVar14 = *(void **)(local_178 + lVar21 + -8);
    if (pvVar14 != (void *)0x0) {
      operator_delete(pvVar14,*(long *)(local_178 + lVar21 + 8) - (long)pvVar14);
    }
    lVar21 = lVar21 + -0x18;
  } while (lVar21 != 0);
  local_6f8 = (undefined1  [8])&aStack_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"Contribution","");
  local_aa8._0_8_ = &local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"Contributions","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_168,log,(string *)local_6f8,(string *)local_aa8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_598,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)local_5a8._0_8_,0,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_start) >>
                  6),1,0);
  local_900.m_name._M_dataplus._M_p = (pointer)&local_900.m_name.field_2;
  local_900.m_name.field_2._M_allocated_capacity._0_7_ = 0x736e6f4370614d;
  local_900.m_name.field_2._M_local_buf[7] = 't';
  local_900.m_name.field_2._8_7_ = 0x74736f43746e61;
  local_900.m_name._M_string_length = 0xf;
  local_900.m_name.field_2._M_local_buf[0xf] = '\0';
  local_9d0.m_name._M_dataplus._M_p = (pointer)&local_9d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d0,"Map: Approximated contant cost","");
  local_968.m_name._M_dataplus._M_p = (pointer)&local_968.m_name.field_2;
  local_968.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_968.m_name._M_string_length = 2;
  local_968.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_6f8,&local_900.m_name,&local_9d0.m_name,&local_968.m_name,
             QP_KEY_TAG_TIME,(float)local_598._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_6f8,(char *)CONCAT44(fStack_6d4,local_6d8),
             (char *)CONCAT44(fStack_6b4,local_6b8),(qpKeyValueTag)local_698,local_694);
  local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
  local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x694c70614d;
  local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x656e;
  local_898.m_name.field_2._M_local_buf[7] = 'a';
  local_898.m_name.field_2._M_local_buf[8] = 'r';
  local_898.m_name.field_2._9_2_ = 0x6f43;
  local_898.m_name.field_2._M_local_buf[0xb] = 's';
  local_898.m_name.field_2._M_local_buf[0xc] = 't';
  local_898.m_name._M_string_length = 0xd;
  local_898.m_name.field_2._M_local_buf[0xd] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_a38.m_name._M_dataplus._M_p = (char *)0x1d;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_a38);
  local_678.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_a38.m_name._M_dataplus._M_p,0);
  local_678.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a38.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Map: Approximated linear cost",0x1d);
  local_678.m_name._M_string_length = (size_type)local_a38.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_a38.m_name._M_dataplus._M_p] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_610.m_name.field_2._M_local_buf[2] = ' ';
  local_610.m_name.field_2._M_allocated_capacity._3_4_ = 0x424d202f;
  local_610.m_name._M_string_length = 7;
  local_610.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name,
             QP_KEY_TAG_TIME,(float)local_598._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
             local_a48,local_a44);
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x4d70614d;
  local_830.m_name.field_2._M_local_buf[4] = 'e';
  local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x6964;
  local_830.m_name.field_2._M_local_buf[7] = 'a';
  local_830.m_name.field_2._M_local_buf[8] = 'n';
  local_830.m_name.field_2._9_2_ = 0x6f43;
  local_830.m_name.field_2._M_local_buf[0xb] = 's';
  local_830.m_name.field_2._M_local_buf[0xc] = 't';
  local_830.m_name._M_string_length = 0xd;
  local_830.m_name.field_2._M_local_buf[0xd] = '\0';
  local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
  local_7c8.m_name._M_dataplus._M_p = (pointer)0x10;
  local_760.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_760,(ulong)&local_7c8);
  local_760.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_7c8.m_name._M_dataplus._M_p,0);
  local_760.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_7c8.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_760.m_name._M_dataplus._M_p,"Map: Median cost",0x10);
  local_760.m_name._M_string_length = (size_type)local_7c8.m_name._M_dataplus._M_p;
  local_760.m_name._M_dataplus._M_p[(long)local_7c8.m_name._M_dataplus._M_p] = '\0';
  local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
  local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7c8.m_name._M_string_length = 2;
  local_7c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
             local_b0.map.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
             local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_598,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)local_5a8._0_8_,0,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_start) >>
                  6),1,8);
  local_900.m_name._M_dataplus._M_p = (pointer)&local_900.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"UnmapConstantCost","");
  local_9d0.m_name._M_dataplus._M_p = (pointer)&local_9d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d0,"Unmap: Approximated contant cost","");
  local_968.m_name._M_dataplus._M_p = (pointer)&local_968.m_name.field_2;
  local_968.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_968.m_name._M_string_length = 2;
  local_968.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_6f8,&local_900.m_name,&local_9d0.m_name,&local_968.m_name,
             QP_KEY_TAG_TIME,(float)local_598._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_6f8,(char *)CONCAT44(fStack_6d4,local_6d8),
             (char *)CONCAT44(fStack_6b4,local_6b8),(qpKeyValueTag)local_698,local_694);
  local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
  local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
  local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_898.m_name.field_2._M_local_buf[7] = 'n';
  local_898.m_name.field_2._M_local_buf[8] = 'e';
  local_898.m_name.field_2._9_2_ = 0x7261;
  local_898.m_name.field_2._M_local_buf[0xb] = 'C';
  local_898.m_name.field_2._M_local_buf[0xc] = 'o';
  local_898.m_name.field_2._M_local_buf[0xd] = 's';
  local_898.m_name.field_2._M_local_buf[0xe] = 't';
  local_898.m_name._M_string_length = 0xf;
  local_898.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_a38.m_name._M_dataplus._M_p = (char *)0x1f;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_a38);
  local_678.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_a38.m_name._M_dataplus._M_p,0);
  local_678.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a38.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Unmap: Approximated linear cost",0x1f);
  local_678.m_name._M_string_length = (size_type)local_a38.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_a38.m_name._M_dataplus._M_p] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_610.m_name.field_2._M_local_buf[2] = ' ';
  local_610.m_name.field_2._M_allocated_capacity._3_4_ = 0x424d202f;
  local_610.m_name._M_string_length = 7;
  local_610.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name,
             QP_KEY_TAG_TIME,(float)local_598._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
             local_a48,local_a44);
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
  local_830.m_name.field_2._M_local_buf[4] = 'p';
  local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_830.m_name.field_2._M_local_buf[7] = 'd';
  local_830.m_name.field_2._M_local_buf[8] = 'i';
  local_830.m_name.field_2._9_2_ = 0x6e61;
  local_830.m_name.field_2._M_local_buf[0xb] = 'C';
  local_830.m_name.field_2._M_local_buf[0xc] = 'o';
  local_830.m_name.field_2._M_local_buf[0xd] = 's';
  local_830.m_name.field_2._M_local_buf[0xe] = 't';
  local_830.m_name._M_string_length = 0xf;
  local_830.m_name.field_2._M_local_buf[0xf] = '\0';
  local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
  local_7c8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_760.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_760,(ulong)&local_7c8);
  local_760.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_7c8.m_name._M_dataplus._M_p,0);
  local_760.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_7c8.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_760.m_name._M_dataplus._M_p,"Unmap: Median cost",0x12);
  local_760.m_name._M_string_length = (size_type)local_7c8.m_name._M_dataplus._M_p;
  local_760.m_name._M_dataplus._M_p[(long)local_7c8.m_name._M_dataplus._M_p] = '\0';
  local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
  local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7c8.m_name._M_string_length = 2;
  local_7c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
             local_b0.unmap.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
             local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_598,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)local_5a8._0_8_,0,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_start) >>
                  6),1,0x10);
  local_900.m_name._M_dataplus._M_p = (pointer)&local_900.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"WriteConstantCost","");
  local_9d0.m_name._M_dataplus._M_p = (pointer)&local_9d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d0,"Write: Approximated contant cost","");
  local_968.m_name._M_dataplus._M_p = (pointer)&local_968.m_name.field_2;
  local_968.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_968.m_name._M_string_length = 2;
  local_968.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_6f8,&local_900.m_name,&local_9d0.m_name,&local_968.m_name,
             QP_KEY_TAG_TIME,(float)local_598._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_6f8,(char *)CONCAT44(fStack_6d4,local_6d8),
             (char *)CONCAT44(fStack_6b4,local_6b8),(qpKeyValueTag)local_698,local_694);
  local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
  local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
  local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_898.m_name.field_2._M_local_buf[7] = 'n';
  local_898.m_name.field_2._M_local_buf[8] = 'e';
  local_898.m_name.field_2._9_2_ = 0x7261;
  local_898.m_name.field_2._M_local_buf[0xb] = 'C';
  local_898.m_name.field_2._M_local_buf[0xc] = 'o';
  local_898.m_name.field_2._M_local_buf[0xd] = 's';
  local_898.m_name.field_2._M_local_buf[0xe] = 't';
  local_898.m_name._M_string_length = 0xf;
  local_898.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_a38.m_name._M_dataplus._M_p = (char *)0x1f;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_a38);
  local_678.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_a38.m_name._M_dataplus._M_p,0);
  local_678.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a38.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Write: Approximated linear cost",0x1f);
  local_678.m_name._M_string_length = (size_type)local_a38.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_a38.m_name._M_dataplus._M_p] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_610.m_name.field_2._M_local_buf[2] = ' ';
  local_610.m_name.field_2._M_allocated_capacity._3_4_ = 0x424d202f;
  local_610.m_name._M_string_length = 7;
  local_610.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name,
             QP_KEY_TAG_TIME,(float)local_598._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
             local_a48,local_a44);
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
  local_830.m_name.field_2._M_local_buf[4] = 'e';
  local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_830.m_name.field_2._M_local_buf[7] = 'd';
  local_830.m_name.field_2._M_local_buf[8] = 'i';
  local_830.m_name.field_2._9_2_ = 0x6e61;
  local_830.m_name.field_2._M_local_buf[0xb] = 'C';
  local_830.m_name.field_2._M_local_buf[0xc] = 'o';
  local_830.m_name.field_2._M_local_buf[0xd] = 's';
  local_830.m_name.field_2._M_local_buf[0xe] = 't';
  local_830.m_name._M_string_length = 0xf;
  local_830.m_name.field_2._M_local_buf[0xf] = '\0';
  local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
  local_7c8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_760.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_760,(ulong)&local_7c8);
  local_760.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_7c8.m_name._M_dataplus._M_p,0);
  local_760.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_7c8.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_760.m_name._M_dataplus._M_p,"Write: Median cost",0x12);
  local_760.m_name._M_string_length = (size_type)local_7c8.m_name._M_dataplus._M_p;
  local_760.m_name._M_dataplus._M_p[(long)local_7c8.m_name._M_dataplus._M_p] = '\0';
  local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
  local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7c8.m_name._M_string_length = 2;
  local_7c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
             local_b0.write.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
             local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_598,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)local_5a8._0_8_,0,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)local_5a8._0_8_)->_M_impl).super__Vector_impl_data._M_start) >>
                  6),1,0x18);
  local_900.m_name._M_dataplus._M_p = (pointer)&local_900.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"AllocConstantCost","");
  local_9d0.m_name._M_dataplus._M_p = (pointer)&local_9d0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d0,"Alloc: Approximated contant cost","");
  local_968.m_name._M_dataplus._M_p = (pointer)&local_968.m_name.field_2;
  local_968.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_968.m_name._M_string_length = 2;
  local_968.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_6f8,&local_900.m_name,&local_9d0.m_name,&local_968.m_name,
             QP_KEY_TAG_TIME,(float)local_598._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_6f8,(char *)CONCAT44(fStack_6d4,local_6d8),
             (char *)CONCAT44(fStack_6b4,local_6b8),(qpKeyValueTag)local_698,local_694);
  local_898.m_name._M_dataplus._M_p = (pointer)&local_898.m_name.field_2;
  local_898.m_name.field_2._M_allocated_capacity._0_5_ = 0x636f6c6c41;
  local_898.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_898.m_name.field_2._M_local_buf[7] = 'n';
  local_898.m_name.field_2._M_local_buf[8] = 'e';
  local_898.m_name.field_2._9_2_ = 0x7261;
  local_898.m_name.field_2._M_local_buf[0xb] = 'C';
  local_898.m_name.field_2._M_local_buf[0xc] = 'o';
  local_898.m_name.field_2._M_local_buf[0xd] = 's';
  local_898.m_name.field_2._M_local_buf[0xe] = 't';
  local_898.m_name._M_string_length = 0xf;
  local_898.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_a38.m_name._M_dataplus._M_p = (char *)0x1f;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_a38);
  local_678.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_a38.m_name._M_dataplus._M_p,0);
  local_678.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_a38.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Alloc: Approximated linear cost",0x1f);
  local_678.m_name._M_string_length = (size_type)local_a38.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_a38.m_name._M_dataplus._M_p] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_610.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_610.m_name.field_2._M_local_buf[2] = ' ';
  local_610.m_name.field_2._M_allocated_capacity._3_4_ = 0x424d202f;
  local_610.m_name._M_string_length = 7;
  local_610.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_aa8,&local_898.m_name,&local_678.m_name,&local_610.m_name,
             QP_KEY_TAG_TIME,(float)local_598._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
             local_a48,local_a44);
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  local_830.m_name.field_2._M_allocated_capacity._0_4_ = 0x6f6c6c41;
  local_830.m_name.field_2._M_local_buf[4] = 'c';
  local_830.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_830.m_name.field_2._M_local_buf[7] = 'd';
  local_830.m_name.field_2._M_local_buf[8] = 'i';
  local_830.m_name.field_2._9_2_ = 0x6e61;
  local_830.m_name.field_2._M_local_buf[0xb] = 'C';
  local_830.m_name.field_2._M_local_buf[0xc] = 'o';
  local_830.m_name.field_2._M_local_buf[0xd] = 's';
  local_830.m_name.field_2._M_local_buf[0xe] = 't';
  local_830.m_name._M_string_length = 0xf;
  local_830.m_name.field_2._M_local_buf[0xf] = '\0';
  local_760.m_name._M_dataplus._M_p = (pointer)&local_760.m_name.field_2;
  local_7c8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_760.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_760,(ulong)&local_7c8);
  local_760.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_7c8.m_name._M_dataplus._M_p,0);
  local_760.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_7c8.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_760.m_name._M_dataplus._M_p,"Alloc: Median cost",0x12);
  local_760.m_name._M_string_length = (size_type)local_7c8.m_name._M_dataplus._M_p;
  local_760.m_name._M_dataplus._M_p[(long)local_7c8.m_name._M_dataplus._M_p] = '\0';
  local_7c8.m_name._M_dataplus._M_p = (pointer)&local_7c8.m_name.field_2;
  local_7c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7c8.m_name._M_string_length = 2;
  local_7c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a38,&local_830.m_name,&local_760.m_name,&local_7c8.m_name,QP_KEY_TAG_TIME,
             local_b0.alloc.medianTime);
  tcu::TestLog::writeFloat
            (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
             local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  uVar5 = local_5a8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_168._M_dataplus._M_p);
  local_6f8 = (undefined1  [8])&aStack_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"Results","");
  local_aa8._0_8_ = &local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_1a0,log,(string *)local_6f8,(string *)local_aa8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  pUVar3 = (((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5)->_M_impl).super__Vector_impl_data._M_start;
  pUVar4 = (((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5)->_M_impl).super__Vector_impl_data._M_finish;
  fVar28 = (float)((pUVar4[-1].bufferSize + pUVar3->bufferSize) / 2);
  local_1dc = local_1bc.coefficient * fVar28;
  local_1d8 = local_1bc.offset + local_1dc;
  uVar17 = (long)pUVar4 - (long)pUVar3;
  endNdx = (int)(((uint)(uVar17 >> 0x25) & 1) + (int)(uVar17 >> 6)) >> 1;
  local_ab0._0_4_ = fVar28;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_6f8,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5,0,endNdx,1,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_aa8,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5,endNdx,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)uVar5)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)uVar5)->_M_impl).super__Vector_impl_data._M_start) >> 6),1,0x28
            );
  local_a3c = (float)((((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                         *)uVar5)->_M_impl).super__Vector_impl_data._M_start)->writtenSize;
  fVar28 = (float)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                     *)uVar5)->_M_impl).super__Vector_impl_data._M_finish[-1].writtenSize;
  local_390 = (string *)CONCAT44(local_390._4_4_,fVar28);
  local_1c4 = (float)local_6f8._0_4_;
  local_e8 = ZEXT416((uint)local_6f0._4_4_);
  local_1c0 = (float)local_aa8._0_4_;
  local_178 = ZEXT416((uint)local_aa8._12_4_);
  fVar28 = getAreaBetweenLines(local_a3c,fVar28,(float)local_6f8._0_4_,local_6f0._4_4_,
                               (float)local_aa8._0_4_,(float)local_aa8._12_4_);
  local_1e8 = (pointer)CONCAT44(local_1e8._4_4_,fVar28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_6f8,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5,0,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)uVar5)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)uVar5)->_M_impl).super__Vector_impl_data._M_start) >> 6),2,0x28
            );
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>
            ((LineParametersWithConfidence *)local_aa8,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
              *)uVar5,1,
             (int)((ulong)((long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                    *)uVar5)->_M_impl).super__Vector_impl_data._M_finish -
                          (long)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                                   *)uVar5)->_M_impl).super__Vector_impl_data._M_start) >> 6),2,0x28
            );
  fVar28 = (float)((((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                      *)uVar5)->_M_impl).super__Vector_impl_data._M_start)->writtenSize;
  local_1c8 = (float)(((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDuration>_>_>
                        *)uVar5)->_M_impl).super__Vector_impl_data._M_finish[-1].writtenSize;
  local_5a8._0_4_ = fVar28;
  local_1d4 = (float)local_6f8._0_4_;
  local_c8 = ZEXT416((uint)local_6f0._4_4_);
  local_1d0 = (float)local_aa8._0_4_;
  local_d8 = ZEXT416((uint)local_aa8._12_4_);
  local_1cc = getAreaBetweenLines(fVar28,local_1c8,(float)local_6f8._0_4_,local_6f0._4_4_,
                                  (float)local_aa8._0_4_,(float)local_aa8._12_4_);
  local_598._0_8_ = &local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"ResultLinearity","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Sample linearity","");
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"%","");
  fVar28 = (float)local_e8._0_4_ * local_a3c + local_1c4;
  fVar27 = (float)local_178._0_4_ * local_a3c + local_1c0;
  uVar12 = -(uint)(fVar28 <= fVar27);
  fVar29 = (float)local_e8._0_4_ * local_390._0_4_ + local_1c4;
  fVar30 = (float)local_178._0_4_ * local_390._0_4_ + local_1c0;
  uVar26 = -(uint)(fVar30 <= fVar29);
  fVar28 = ((float)(~uVar26 & (uint)fVar30 | (uint)fVar29 & uVar26) -
           (float)(~uVar12 & (uint)fVar27 | (uint)fVar28 & uVar12)) * (local_390._0_4_ - local_a3c);
  fVar27 = (float)(~-(uint)(fVar28 < 1e-06) & (uint)(1.0 - local_1e8._0_4_ / fVar28));
  fVar28 = 1.0;
  if (fVar27 <= 1.0) {
    fVar28 = fVar27;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_6f8,(string *)local_598,&local_168,&local_b50,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar27 < 0.0) & (uint)(fVar28 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_6f8,(char *)CONCAT44(fStack_6d4,local_6d8),
             (char *)CONCAT44(fStack_6b4,local_6b8),(qpKeyValueTag)local_698,local_694);
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"SampleTemporalStability","")
  ;
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad0,"Sample temporal stability","");
  local_b70._M_dataplus._M_p = (pointer)&local_b70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b70,"%","");
  fVar28 = (float)local_c8._0_4_ * (float)local_5a8._0_4_ + local_1d4;
  fVar27 = (float)local_d8._0_4_ * (float)local_5a8._0_4_ + local_1d0;
  uVar12 = -(uint)(fVar28 <= fVar27);
  fVar29 = (float)local_c8._0_4_ * local_1c8 + local_1d4;
  fVar30 = (float)local_d8._0_4_ * local_1c8 + local_1d0;
  uVar26 = -(uint)(fVar30 <= fVar29);
  fVar28 = ((float)(~uVar26 & (uint)fVar30 | (uint)fVar29 & uVar26) -
           (float)(~uVar12 & (uint)fVar27 | (uint)fVar28 & uVar12)) *
           (local_1c8 - (float)local_5a8._0_4_);
  fVar27 = (float)(~-(uint)(fVar28 < 1e-06) & (uint)(1.0 - local_1cc / fVar28));
  fVar28 = 1.0;
  if (fVar27 <= 1.0) {
    fVar28 = fVar27;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_aa8,&local_b10,&local_ad0,&local_b70,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar27 < 0.0) & (uint)(fVar28 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_aa8._0_8_,local_a88._M_dataplus._M_p,local_a68._M_dataplus._M_p,
             local_a48,local_a44);
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b30,"ApproximatedConstantCost","");
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_af0,"Approximated contant cost","");
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_a38,&local_b30,&local_af0,&local_b90,QP_KEY_TAG_TIME,local_1bc.offset);
  tcu::TestLog::writeFloat
            (log,local_a38.m_name._M_dataplus._M_p,local_a38.m_desc._M_dataplus._M_p,
             local_a38.m_unit._M_dataplus._M_p,local_a38.m_tag,local_a38.m_value);
  local_bb0._M_dataplus._M_p = (pointer)&local_bb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bb0,"ApproximatedConstantCostConfidence60Lower","");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b0,"Approximated contant cost 60% confidence lower limit","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_900,&local_bb0,&local_3b0,&local_450,QP_KEY_TAG_TIME,
             local_1bc.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_900.m_name._M_dataplus._M_p,local_900.m_desc._M_dataplus._M_p,
             local_900.m_unit._M_dataplus._M_p,local_900.m_tag,local_900.m_value);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"ApproximatedConstantCostConfidence60Upper","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d0,"Approximated contant cost 60% confidence upper limit","");
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_9d0,&local_470,&local_3d0,&local_490,QP_KEY_TAG_TIME,
             local_1bc.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_9d0.m_name._M_dataplus._M_p,local_9d0.m_desc._M_dataplus._M_p,
             local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,local_9d0.m_value);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"ApproximatedLinearCost","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,"Approximated linear cost","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_968,&local_4b0,&local_3f0,&local_4d0,QP_KEY_TAG_TIME,
             local_1bc.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_968.m_name._M_dataplus._M_p,local_968.m_desc._M_dataplus._M_p,
             local_968.m_unit._M_dataplus._M_p,local_968.m_tag,local_968.m_value);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f0,"ApproximatedLinearCostConfidence60Lower","");
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_410,"Approximated linear cost 60% confidence lower limit","");
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_898,&local_4f0,&local_410,&local_510,QP_KEY_TAG_TIME,
             local_1bc.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_898.m_name._M_dataplus._M_p,local_898.m_desc._M_dataplus._M_p,
             local_898.m_unit._M_dataplus._M_p,local_898.m_tag,local_898.m_value);
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_530,"ApproximatedLinearCostConfidence60Upper","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_430,"Approximated linear cost 60% confidence upper limit","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_678,&local_530,&local_430,&local_388,QP_KEY_TAG_TIME,
             local_1bc.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_678.m_name._M_dataplus._M_p,local_678.m_desc._M_dataplus._M_p,
             local_678.m_unit._M_dataplus._M_p,local_678.m_tag,local_678.m_value);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"ApproximatedTransferRate","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"Approximated transfer rate","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"MB / s","");
  fVar28 = (float)local_ab0 / ((local_1d8 / 1000.0) / 1000.0);
  local_5a8 = ZEXT416((uint)fVar28);
  tcu::LogNumber<float>::LogNumber
            (&local_610,&local_288,&local_208,&local_2a8,QP_KEY_TAG_PERFORMANCE,
             fVar28 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_610.m_name._M_dataplus._M_p,local_610.m_desc._M_dataplus._M_p,
             local_610.m_unit._M_dataplus._M_p,local_610.m_tag,local_610.m_value);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,"ApproximatedTransferRateNoConstant","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Approximated transfer rate without constant cost","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"MB / s","");
  local_ab0._0_4_ = (float)local_ab0 / ((local_1dc / 1000.0) / 1000.0);
  tcu::LogNumber<float>::LogNumber
            (&local_830,&local_2c8,&local_228,&local_2e8,QP_KEY_TAG_PERFORMANCE,
             (float)local_ab0 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_830.m_name._M_dataplus._M_p,local_830.m_desc._M_dataplus._M_p,
             local_830.m_unit._M_dataplus._M_p,local_830.m_tag,local_830.m_value);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"SampleMedianTime","");
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Median sample time","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_760,&local_308,&local_248,&local_328,QP_KEY_TAG_TIME,local_b0.result.medianTime)
  ;
  tcu::TestLog::writeFloat
            (log,local_760.m_name._M_dataplus._M_p,local_760.m_desc._M_dataplus._M_p,
             local_760.m_unit._M_dataplus._M_p,local_760.m_tag,local_760.m_value);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"SampleMedianTransfer","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Median transfer rate","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_7c8,&local_348,&local_268,&local_368,QP_KEY_TAG_PERFORMANCE,
             local_b0.medianRate * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_7c8.m_name._M_dataplus._M_p,local_7c8.m_desc._M_dataplus._M_p,
             local_7c8.m_unit._M_dataplus._M_p,local_7c8.m_tag,local_7c8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_unit._M_dataplus._M_p != &local_7c8.m_unit.field_2) {
    operator_delete(local_7c8.m_unit._M_dataplus._M_p,
                    local_7c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_desc._M_dataplus._M_p != &local_7c8.m_desc.field_2) {
    operator_delete(local_7c8.m_desc._M_dataplus._M_p,
                    local_7c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8.m_name._M_dataplus._M_p != &local_7c8.m_name.field_2) {
    operator_delete(local_7c8.m_name._M_dataplus._M_p,
                    CONCAT17(local_7c8.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_7c8.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_7c8.m_name.field_2._M_local_buf[2],
                                               local_7c8.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_unit._M_dataplus._M_p != &local_760.m_unit.field_2) {
    operator_delete(local_760.m_unit._M_dataplus._M_p,
                    local_760.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_desc._M_dataplus._M_p != &local_760.m_desc.field_2) {
    operator_delete(local_760.m_desc._M_dataplus._M_p,
                    local_760.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.m_name._M_dataplus._M_p != &local_760.m_name.field_2) {
    operator_delete(local_760.m_name._M_dataplus._M_p,
                    CONCAT44(local_760.m_name.field_2._M_allocated_capacity._4_4_,
                             local_760.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_unit._M_dataplus._M_p != &local_830.m_unit.field_2) {
    operator_delete(local_830.m_unit._M_dataplus._M_p,
                    local_830.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_desc._M_dataplus._M_p != &local_830.m_desc.field_2) {
    operator_delete(local_830.m_desc._M_dataplus._M_p,
                    local_830.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    CONCAT17(local_830.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_830.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_830.m_name.field_2._M_local_buf[4],
                                               local_830.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_unit._M_dataplus._M_p != &local_610.m_unit.field_2) {
    operator_delete(local_610.m_unit._M_dataplus._M_p,
                    local_610.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_desc._M_dataplus._M_p != &local_610.m_desc.field_2) {
    operator_delete(local_610.m_desc._M_dataplus._M_p,
                    local_610.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    CONCAT17(local_610.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_610.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_610.m_name.field_2._M_local_buf[2],
                                               local_610.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_unit._M_dataplus._M_p != &local_678.m_unit.field_2) {
    operator_delete(local_678.m_unit._M_dataplus._M_p,
                    local_678.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_desc._M_dataplus._M_p != &local_678.m_desc.field_2) {
    operator_delete(local_678.m_desc._M_dataplus._M_p,
                    local_678.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             local_678.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT53(local_430.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_430.field_2._M_local_buf[2],
                                      local_430.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_unit._M_dataplus._M_p != &local_898.m_unit.field_2) {
    operator_delete(local_898.m_unit._M_dataplus._M_p,
                    local_898.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_desc._M_dataplus._M_p != &local_898.m_desc.field_2) {
    operator_delete(local_898.m_desc._M_dataplus._M_p,
                    local_898.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898.m_name._M_dataplus._M_p != &local_898.m_name.field_2) {
    operator_delete(local_898.m_name._M_dataplus._M_p,
                    CONCAT17(local_898.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_898.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_898.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,
                    CONCAT17(local_510.field_2._M_local_buf[7],
                             local_510.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_unit._M_dataplus._M_p != &local_968.m_unit.field_2) {
    operator_delete(local_968.m_unit._M_dataplus._M_p,
                    local_968.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_desc._M_dataplus._M_p != &local_968.m_desc.field_2) {
    operator_delete(local_968.m_desc._M_dataplus._M_p,
                    local_968.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968.m_name._M_dataplus._M_p != &local_968.m_name.field_2) {
    operator_delete(local_968.m_name._M_dataplus._M_p,
                    CONCAT53(local_968.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_968.m_name.field_2._M_local_buf[2],
                                      local_968.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT53(local_3f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3f0.field_2._M_local_buf[2],
                                      local_3f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT53(local_3d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3d0.field_2._M_local_buf[2],
                                      local_3d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_unit._M_dataplus._M_p != &local_900.m_unit.field_2) {
    operator_delete(local_900.m_unit._M_dataplus._M_p,
                    local_900.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_desc._M_dataplus._M_p != &local_900.m_desc.field_2) {
    operator_delete(local_900.m_desc._M_dataplus._M_p,
                    local_900.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900.m_name._M_dataplus._M_p != &local_900.m_name.field_2) {
    operator_delete(local_900.m_name._M_dataplus._M_p,
                    CONCAT17(local_900.m_name.field_2._M_local_buf[7],
                             local_900.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                             local_450.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT53(local_3b0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3b0.field_2._M_local_buf[2],
                                      local_3b0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
    operator_delete(local_bb0._M_dataplus._M_p,local_bb0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_unit._M_dataplus._M_p != &local_a38.m_unit.field_2) {
    operator_delete(local_a38.m_unit._M_dataplus._M_p,
                    local_a38.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_desc._M_dataplus._M_p != &local_a38.m_desc.field_2) {
    operator_delete(local_a38.m_desc._M_dataplus._M_p,
                    local_a38.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38.m_name._M_dataplus._M_p != &local_a38.m_name.field_2) {
    operator_delete(local_a38.m_name._M_dataplus._M_p,
                    local_a38.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p,local_b90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,
                    CONCAT17(local_af0.field_2._M_local_buf[7],
                             CONCAT16(local_af0.field_2._M_local_buf[6],
                                      CONCAT42(local_af0.field_2._M_allocated_capacity._2_4_,
                                               local_af0.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a68._M_dataplus._M_p != &local_a68.field_2) {
    operator_delete(local_a68._M_dataplus._M_p,local_a68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._0_8_ != &local_a98) {
    operator_delete((void *)local_aa8._0_8_,local_a98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
    operator_delete(local_b70._M_dataplus._M_p,(ulong)(local_b70.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p,
                    CONCAT26(local_ad0.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_ad0.field_2._M_local_buf[5],
                                      CONCAT14(local_ad0.field_2._M_local_buf[4],
                                               local_ad0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p,
                    CONCAT17(local_b10.field_2._M_local_buf[7],
                             CONCAT43(local_b10.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_b10.field_2._M_local_buf[2],
                                               local_b10.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6b4,local_6b8) != &local_6a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6b4,local_6b8),
                    CONCAT44(local_6a8._M_allocated_capacity._4_4_,
                             local_6a8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(fStack_6d4,local_6d8) != &local_6c8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(fStack_6d4,local_6d8),
                    CONCAT44(local_6c8._M_allocated_capacity._4_4_,
                             local_6c8._M_allocated_capacity._0_4_) + 1);
  }
  if (local_6f8 != (undefined1  [8])&aStack_6e8) {
    operator_delete((void *)local_6f8,aStack_6e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p,(ulong)(local_b50.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._0_8_ != &local_588) {
    operator_delete((void *)local_598._0_8_,
                    CONCAT35(local_588._M_allocated_capacity._5_3_,
                             local_588._M_allocated_capacity._0_5_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_1a0._M_dataplus._M_p);
  UVar31.transferRateAtRange = (float)local_5a8._0_4_;
  UVar31.transferRateMedian = local_b0.medianRate;
  UVar31.transferRateAtInfinity = (float)local_ab0;
  return UVar31;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}